

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multipartExamples.cpp
# Opt level: O1

void insertDeepSlice<float>
               (Box2i *dataWindow,DeepFrameBuffer *frameBuffer,char *name,PixelType pixelType,
               list<Imf_3_4::Array2D<float_*>,_std::allocator<Imf_3_4::Array2D<float_*>_>_>
               *channels)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  long lVar4;
  int iVar5;
  int iVar6;
  DeepSlice local_68 [56];
  
  iVar5 = ((dataWindow->max).x - (dataWindow->min).x) + 1;
  iVar6 = ((dataWindow->max).y - (dataWindow->min).y) + 1;
  p_Var2 = (_List_node_base *)operator_new(0x28);
  p_Var2[1]._M_next = (_List_node_base *)0x0;
  p_Var2[1]._M_prev = (_List_node_base *)0x0;
  p_Var2[2]._M_next = (_List_node_base *)0x0;
  std::__detail::_List_node_base::_M_hook(p_Var2);
  psVar1 = &(channels->
            super__List_base<Imf_3_4::Array2D<float_*>,_std::allocator<Imf_3_4::Array2D<float_*>_>_>
            )._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  p_Var2 = (channels->
           super__List_base<Imf_3_4::Array2D<float_*>,_std::allocator<Imf_3_4::Array2D<float_*>_>_>)
           ._M_impl._M_node.super__List_node_base._M_prev;
  lVar4 = (long)iVar5;
  p_Var3 = (_List_node_base *)
           operator_new__(-(ulong)((ulong)(iVar6 * lVar4) >> 0x3d != 0) | iVar6 * lVar4 * 8);
  if (p_Var2[2]._M_next != (_List_node_base *)0x0) {
    operator_delete__(p_Var2[2]._M_next);
  }
  *(int *)&p_Var2[1]._M_next = iVar6;
  *(uint *)((long)&p_Var2[1]._M_next + 4) = -(uint)(iVar6 < 0);
  *(int *)&p_Var2[1]._M_prev = iVar5;
  *(uint *)((long)&p_Var2[1]._M_prev + 4) = -(uint)(iVar5 < 0);
  p_Var2[2]._M_next = p_Var3;
  Imf_3_4::DeepSlice::DeepSlice
            (local_68,pixelType,
             (char *)((long)p_Var3 +
                     (dataWindow->min).y * lVar4 * -8 + (long)(dataWindow->min).x * -8),8,lVar4 << 3
             ,4,1,1,0.0,false,false);
  Imf_3_4::DeepFrameBuffer::insert((char *)frameBuffer,(DeepSlice *)name);
  return;
}

Assistant:

void
insertDeepSlice (
    Box2i&                     dataWindow,
    DeepFrameBuffer&           frameBuffer,
    const char                 name[],
    PixelType                  pixelType,
    list<Array2D<ValueType*>>& channels)
{
    //
    // Allocate a pixel buffer and describe the layout of
    // the buffer in the DeepFrameBuffer object.
    //

    size_t width  = dataWindow.max.x - dataWindow.min.x + 1;
    size_t height = dataWindow.max.y - dataWindow.min.y + 1;

    channels.emplace_back ();
    Array2D<ValueType*>& buffer = channels.back ();
    buffer.resizeErase (height, width);

    char* base =
        (char*) (&buffer[0][0] - dataWindow.min.x - dataWindow.min.y * width);

    frameBuffer.insert (
        name, // name
        DeepSlice (
            pixelType,                   // type
            base,                        // base
            sizeof (ValueType*) * 1,     // xStride
            sizeof (ValueType*) * width, // yStride
            sizeof (ValueType)           // sample stride
            ));
}